

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

OrphanBuilder *
capnp::_::OrphanBuilder::initList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,ElementSize elementSize)

{
  word *pwVar1;
  undefined8 extraout_RAX;
  word *pwVar2;
  AllocateResult AVar3;
  anon_class_1_0_00000001 local_29;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  if (0x1fffffff < elementCount) {
    ::anon_func::anon_class_1_0_00000001::operator()(&local_29);
  }
  if (arena != (BuilderArena *)0x0) {
    AVar3 = BuilderArena::allocate
                      (arena,(SegmentWordCount)
                             ((ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE +
                                              (ulong)(uint)elementSize * 4) * (ulong)elementCount +
                              0x3f >> 6));
    pwVar2 = AVar3.words;
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(ElementCount *)((long)&(__return_storage_ptr__->tag).content + 4) =
         elementCount << 3 | (uint)elementSize;
    __return_storage_ptr__->segment = AVar3.segment;
    __return_storage_ptr__->capTable = capTable;
    pwVar1 = pwVar2 + -1;
    if (pwVar2 == (word *)0x0) {
      pwVar1 = pwVar2;
    }
    if (elementSize != INLINE_COMPOSITE) {
      pwVar1 = pwVar2;
    }
    __return_storage_ptr__->location = pwVar1;
    return __return_storage_ptr__;
  }
  WireHelpers::zeroObject((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
  if (__return_storage_ptr__->segment != (SegmentBuilder *)0x0) {
    euthanize(__return_storage_ptr__);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

OrphanBuilder OrphanBuilder::initList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, ElementSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}